

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O1

void __thiscall JsonObject_KeyIsNotString_Test::TestBody(JsonObject_KeyIsNotString_Test *this)

{
  parser<pstore::json::null_output> *this_00;
  char *pcVar1;
  AssertionResult gtest_ar;
  parser<pstore::json::null_output> p;
  coord local_e8;
  error_code local_e0;
  error_category *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  undefined4 local_c0;
  undefined4 uStack_bc;
  parser<pstore::json::null_output> local_b0;
  
  pstore::json::parser<pstore::json::null_output>::parser(&local_b0,0);
  local_c0 = 0x3a7d7b7b;
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000007;
  uStack_bc = 0x7d7d7b;
  local_d0 = (error_category *)&local_c0;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_e0,7);
  local_e0._M_cat = (error_category *)&local_c0;
  this_00 = pstore::json::parser<pstore::json::null_output>::
            input<pstore::gsl::span<char_const,_1l>>(&local_b0,(span<const_char,__1L> *)&local_e0);
  pstore::json::parser<pstore::json::null_output>::eof(this_00);
  if (local_d0 != (error_category *)&local_c0) {
    operator_delete(local_d0,CONCAT44(uStack_bc,local_c0) + 1);
  }
  local_e0._M_cat = pstore::json::get_error_category();
  local_e0._M_value = 5;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&local_d0,"p.last_error ()",
             "make_error_code (json::error_code::expected_string)",&local_b0.error_,&local_e0);
  if (local_d0._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0xb7,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((long *)local_e0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_e0._0_8_ + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  local_e0._M_value = local_b0.coordinate_.column;
  local_e0._4_4_ = local_b0.coordinate_.row;
  local_e8.column = 2;
  local_e8.row = 1;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)&local_d0,"p.coordinate ()","(json::coord{2U, 1U})",(coord *)&local_e0,
             &local_e8);
  if (local_d0._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0xb8,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((coord)local_e0._0_8_ != (coord)0x0) {
      (**(code **)(*(long *)local_e0._0_8_ + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.string_._M_dataplus._M_p != &local_b0.string_.field_2) {
    operator_delete(local_b0.string_._M_dataplus._M_p,
                    local_b0.string_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>_>_>
  ::~deque(&local_b0.stack_.c);
  if ((_Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
      )local_b0.singletons_._M_t.
       super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
       .
       super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
       ._M_head_impl !=
      (_Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
      )0x0) {
    operator_delete((void *)local_b0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
                            ._M_head_impl,0x68);
  }
  return;
}

Assistant:

TEST_F (JsonObject, KeyIsNotString) {
    json::parser<json::null_output> p;
    p.input ("{{}:{}}"s).eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_string));
    EXPECT_EQ (p.coordinate (), (json::coord{2U, 1U}));
}